

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# call_stack.hpp
# Opt level: O0

void __thiscall
asio::detail::call_stack<asio::detail::thread_context,_asio::detail::thread_info_base>::context::
context(context *this,thread_context *k,thread_info_base *v)

{
  context *pcVar1;
  thread_info_base *v_local;
  thread_context *k_local;
  context *this_local;
  
  noncopyable::noncopyable((noncopyable *)this);
  this->key_ = k;
  this->value_ = v;
  pcVar1 = keyword_tss_ptr::operator_cast_to_context_
                     ((keyword_tss_ptr *)
                      &call_stack<asio::detail::thread_context,asio::detail::thread_info_base>::top_
                     );
  this->next_ = pcVar1;
  tss_ptr<asio::detail::call_stack<asio::detail::thread_context,_asio::detail::thread_info_base>::context>
  ::operator=((tss_ptr<asio::detail::call_stack<asio::detail::thread_context,_asio::detail::thread_info_base>::context>
               *)&call_stack<asio::detail::thread_context,asio::detail::thread_info_base>::top_,this
             );
  return;
}

Assistant:

context(Key* k, Value& v)
      : key_(k),
        value_(&v),
        next_(call_stack<Key, Value>::top_)
    {
      call_stack<Key, Value>::top_ = this;
    }